

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O2

QStringList * __thiscall
QFileSystemComboBoxCompleter::splitPath
          (QStringList *__return_storage_ptr__,QFileSystemComboBoxCompleter *this,QString *path)

{
  QObject *object;
  QFileSystemModel *pQVar1;
  QDir aQStack_58 [8];
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  
  object = (QObject *)::QCompleter::model();
  pQVar1 = qobject_cast<QFileSystemModel*>(object);
  if (pQVar1 != (QFileSystemModel *)0x0) {
    QFileSystemModel::rootPath();
    QDir::QDir(aQStack_58,(QString *)&local_38);
    QDir::filePath((QString *)&local_50);
    ::QCompleter::splitPath((QString *)__return_storage_ptr__);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QDir::~QDir(aQStack_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    return __return_storage_ptr__;
  }
  qt_assert_x("Q_UNREACHABLE()","Q_UNREACHABLE was reached",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/pasnox[P]qtwidgetsextra/qtwidgetsextra/QtWidgetsExtra/FileSystem/QFileSystemComboBox.cpp"
              ,0x16);
}

Assistant:

QStringList splitPath(const QString &path) const override {
        if (const auto model = qobject_cast<QFileSystemModel *>(QCompleter::model())) {
            return QCompleter::splitPath(QDir(model->rootPath()).filePath(path));
        }

        Q_UNREACHABLE();
    }